

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O2

void __thiscall OpenMD::Molecule::addBond(Molecule *this,Bond *bond)

{
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  _Var1;
  Bond *local_10;
  
  local_10 = bond;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::Bond**,std::vector<OpenMD::Bond*,std::allocator<OpenMD::Bond*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::Bond*const>>
                    ((this->bonds_).
                     super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->bonds_).
                     super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::push_back(&this->bonds_,&local_10)
    ;
  }
  return;
}

Assistant:

void Molecule::addBond(Bond* bond) {
    if (std::find(bonds_.begin(), bonds_.end(), bond) == bonds_.end()) {
      bonds_.push_back(bond);
    }
  }